

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O2

void av1_dealloc_dec_jobs(AV1DecTileMTData *tile_mt_info)

{
  if (tile_mt_info != (AV1DecTileMTData *)0x0) {
    if (tile_mt_info->job_mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_destroy((pthread_mutex_t *)tile_mt_info->job_mutex);
      aom_free(tile_mt_info->job_mutex);
    }
    aom_free(tile_mt_info->job_queue);
    tile_mt_info->jobs_enqueued = 0;
    tile_mt_info->jobs_dequeued = 0;
    tile_mt_info->alloc_tile_rows = 0;
    tile_mt_info->alloc_tile_cols = 0;
    tile_mt_info->job_mutex = (pthread_mutex_t *)0x0;
    tile_mt_info->job_queue = (TileJobsDec *)0x0;
  }
  return;
}

Assistant:

void av1_dealloc_dec_jobs(struct AV1DecTileMTData *tile_mt_info) {
  if (tile_mt_info != NULL) {
#if CONFIG_MULTITHREAD
    if (tile_mt_info->job_mutex != NULL) {
      pthread_mutex_destroy(tile_mt_info->job_mutex);
      aom_free(tile_mt_info->job_mutex);
    }
#endif
    aom_free(tile_mt_info->job_queue);
    // clear the structure as the source of this call may be a resize in which
    // case this call will be followed by an _alloc() which may fail.
    av1_zero(*tile_mt_info);
  }
}